

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

void merge_lcp_2way<false>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  uchar **ppuVar1;
  int iVar2;
  lcp_t *plVar3;
  size_t sVar4;
  tuple<int&,unsigned_long&> local_a8 [16];
  tuple<int,_unsigned_long> local_98;
  ulong local_88;
  lcp_t lcp01_1;
  tuple<int&,unsigned_long&> local_78 [4];
  int cmp01_1;
  tuple<int,_unsigned_long> local_68;
  ulong local_58;
  lcp_t lcp01;
  ulong uStack_48;
  int cmp01;
  lcp_t lcp1;
  lcp_t lcp0;
  size_t n1_local;
  lcp_t *lcp_input1_local;
  uchar **from1_local;
  size_t n0_local;
  lcp_t *lcp_input0_local;
  uchar **from0_local;
  
  lcp1 = 0;
  uStack_48 = 0;
  lcp0 = n1;
  n1_local = (size_t)lcp_input1;
  lcp_input1_local = (lcp_t *)from1;
  from1_local = (uchar **)n0;
  n0_local = (size_t)lcp_input0;
  lcp_input0_local = (lcp_t *)from0;
  compare((uchar *)&local_68,*from0,(size_t)*from1);
  std::tie<int,unsigned_long>((int *)local_78,(unsigned_long *)((long)&lcp01 + 4));
  std::tuple<int&,unsigned_long&>::operator=(local_78,&local_68);
  if (lcp01._4_4_ < 1) {
    plVar3 = lcp_input0_local + 1;
    *result = (uchar *)*lcp_input0_local;
    sVar4 = n0_local + 8;
    lcp1 = *(lcp_t *)n0_local;
    uStack_48 = local_58;
    from1_local = (uchar **)((long)from1_local + -1);
    ppuVar1 = result + 1;
    n0_local = sVar4;
    lcp_input0_local = plVar3;
    if (from1_local != (uchar **)0x0) {
LAB_00276ee0:
      result = result + 1;
      do {
        if (uStack_48 < lcp1) {
          iVar2 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
          if (-1 < iVar2) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0xa7,
                          "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                         );
          }
          plVar3 = lcp_input0_local + 1;
          *result = (uchar *)*lcp_input0_local;
          sVar4 = n0_local + 8;
          lcp1 = *(lcp_t *)n0_local;
          from1_local = (uchar **)((long)from1_local + -1);
          ppuVar1 = result + 1;
          n0_local = sVar4;
          lcp_input0_local = plVar3;
          if (from1_local == (uchar **)0x0) break;
        }
        else if (lcp1 < uStack_48) {
          iVar2 = cmp((void *)*lcp_input0_local,(void *)*lcp_input1_local);
          if (iVar2 < 1) {
            __assert_fail("cmp(*from0, *from1) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0xad,
                          "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                         );
          }
          plVar3 = lcp_input1_local + 1;
          *result = (uchar *)*lcp_input1_local;
          sVar4 = n1_local + 8;
          uStack_48 = *(ulong *)n1_local;
          lcp0 = lcp0 - 1;
          ppuVar1 = result + 1;
          n1_local = sVar4;
          lcp_input1_local = plVar3;
          if (lcp0 == 0) goto LAB_00277198;
        }
        else {
          compare((uchar *)&local_98,(uchar *)*lcp_input0_local,*lcp_input1_local);
          std::tie<int,unsigned_long>((int *)local_a8,(unsigned_long *)((long)&lcp01_1 + 4));
          std::tuple<int&,unsigned_long&>::operator=(local_a8,&local_98);
          if (lcp01_1._4_4_ < 1) {
            plVar3 = lcp_input0_local + 1;
            *result = (uchar *)*lcp_input0_local;
            uStack_48 = local_88;
            from1_local = (uchar **)((long)from1_local + -1);
            ppuVar1 = result + 1;
            lcp_input0_local = plVar3;
            if (from1_local == (uchar **)0x0) break;
            lcp1 = *(lcp_t *)n0_local;
            n0_local = n0_local + 8;
          }
          else {
            plVar3 = lcp_input1_local + 1;
            *result = (uchar *)*lcp_input1_local;
            lcp1 = local_88;
            lcp0 = lcp0 - 1;
            ppuVar1 = result + 1;
            lcp_input1_local = plVar3;
            if (lcp0 == 0) goto LAB_00277198;
            uStack_48 = *(ulong *)n1_local;
            n1_local = n1_local + 8;
          }
        }
        result = result + 1;
      } while( true );
    }
    result = ppuVar1;
    from1_local = (uchar **)0x0;
    if (lcp0 == 0) {
      __assert_fail("n1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0xc6,
                    "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                   );
    }
    std::copy<unsigned_char**,unsigned_char**>
              ((uchar **)lcp_input1_local,(uchar **)(lcp_input1_local + lcp0),result);
  }
  else {
    plVar3 = lcp_input1_local + 1;
    *result = (uchar *)*lcp_input1_local;
    sVar4 = n1_local + 8;
    uStack_48 = *(ulong *)n1_local;
    lcp1 = local_58;
    lcp0 = lcp0 - 1;
    ppuVar1 = result + 1;
    n1_local = sVar4;
    lcp_input1_local = plVar3;
    if (lcp0 != 0) goto LAB_00276ee0;
LAB_00277198:
    result = ppuVar1;
    lcp0 = 0;
    if (from1_local == (uchar **)0x0) {
      __assert_fail("n0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0xce,
                    "void merge_lcp_2way(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                   );
    }
    std::copy<unsigned_char**,unsigned_char**>
              ((uchar **)lcp_input0_local,(uchar **)(lcp_input0_local + (long)from1_local),result);
  }
  return;
}

Assistant:

static void
merge_lcp_2way(unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	lcp_t lcp0=0, lcp1=0;
	{
		int cmp01; lcp_t lcp01;
		std::tie(cmp01, lcp01) = compare(*from0, *from1);
		if (cmp01 <= 0) {
			*result++ = *from0++;
			lcp0 = *lcp_input0++;
			lcp1 = lcp01;
			if (--n0 == 0) goto finish0;
		} else {
			*result++ = *from1++;
			lcp1 = *lcp_input1++;
			lcp0 = lcp01;
			if (--n1 == 0) goto finish1;
		}
	}
	while (true) {
		/*
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '"<<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		*/
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (OutputLCP) *lcp_result++ = lcp0;
			if (cmp01 <= 0) {
				*result++ = *from0++;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else {
				*result++ = *from1++;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	assert(n1);
	std::copy(from1, from1+n1, result);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	assert(n0);
	std::copy(from0, from0+n0, result);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	return;
}